

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqstdaux.cpp
# Opt level: O1

void sqstd_printcallstack(HSQUIRRELVM v)

{
  SQObjectType SVar1;
  SQPRINTFUNCTION p_Var2;
  SQRESULT SVar3;
  SQChar *pSVar4;
  char *pcVar5;
  char *pcVar6;
  SQUnsignedInteger idx;
  long level;
  SQUnsignedInteger level_00;
  SQFloat f;
  SQBool bval;
  SQChar *s;
  SQInteger i;
  SQStackInfos si;
  float local_64;
  SQBool local_60;
  char *local_58;
  char *local_50;
  SQStackInfos local_48;
  
  p_Var2 = sq_geterrorfunc(v);
  if (p_Var2 != (SQPRINTFUNCTION)0x0) {
    (*p_Var2)(v,"\nCALLSTACK\n");
    SVar3 = sq_stackinfos(v,1,&local_48);
    if (-1 < SVar3) {
      level = 2;
      do {
        pcVar6 = local_48.funcname;
        if (local_48.funcname == (char *)0x0) {
          pcVar6 = "unknown";
        }
        pcVar5 = local_48.source;
        if (local_48.source == (char *)0x0) {
          pcVar5 = "unknown";
        }
        (*p_Var2)(v,"*FUNCTION [%s()] %s line [%d]\n",pcVar6,pcVar5,local_48.line);
        SVar3 = sq_stackinfos(v,level,&local_48);
        level = level + 1;
      } while (-1 < SVar3);
    }
    (*p_Var2)(v,"\nLOCALS\n");
    level_00 = 0;
    do {
      pSVar4 = sq_getlocal(v,level_00,0);
      if (pSVar4 != (SQChar *)0x0) {
        idx = 1;
        do {
          SVar1 = sq_gettype(v,-1);
          if (0x80001ff < (int)SVar1) {
            if ((int)SVar1 < 0x8010000) {
              if ((int)SVar1 < 0x8001000) {
                if (SVar1 == OT_NATIVECLOSURE) {
                  pcVar6 = "[%s] NATIVECLOSURE\n";
                }
                else {
                  if (SVar1 != OT_GENERATOR) goto LAB_0012a59e;
                  pcVar6 = "[%s] GENERATOR\n";
                }
              }
              else if (SVar1 == OT_THREAD) {
                pcVar6 = "[%s] THREAD\n";
              }
              else {
                if (SVar1 != OT_CLASS) goto LAB_0012a59e;
                pcVar6 = "[%s] CLASS\n";
              }
            }
            else if ((int)SVar1 < 0xa000080) {
              if (SVar1 == OT_WEAKREF) {
                pcVar6 = "[%s] WEAKREF\n";
              }
              else {
                if (SVar1 != OT_TABLE) goto LAB_0012a59e;
                pcVar6 = "[%s] TABLE\n";
              }
            }
            else if (SVar1 == OT_USERDATA) {
              pcVar6 = "[%s] USERDATA\n";
            }
            else {
              if (SVar1 != OT_INSTANCE) goto LAB_0012a59e;
              pcVar6 = "[%s] INSTANCE\n";
            }
            goto LAB_0012a596;
          }
          if ((int)SVar1 < 0x5000004) {
            if ((int)SVar1 < 0x1000008) {
              if (SVar1 == OT_USERPOINTER) {
                pcVar6 = "[%s] USERPOINTER\n";
              }
              else {
                if (SVar1 != OT_NULL) goto LAB_0012a59e;
                pcVar6 = "[%s] NULL\n";
              }
LAB_0012a596:
              (*p_Var2)(v,pcVar6,pSVar4);
            }
            else {
              if (SVar1 == OT_BOOL) {
                sq_getbool(v,-1,&local_60);
                pcVar6 = "false";
                if (local_60 == 1) {
                  pcVar6 = "true";
                }
                pcVar5 = "[%s] %s\n";
              }
              else {
                if (SVar1 != OT_INTEGER) goto LAB_0012a59e;
                sq_getinteger(v,-1,(SQInteger *)&local_50);
                pcVar5 = "[%s] %d\n";
                pcVar6 = local_50;
              }
LAB_0012a56a:
              (*p_Var2)(v,pcVar5,pSVar4,pcVar6);
            }
          }
          else {
            if (0x800003f < (int)SVar1) {
              if (SVar1 == OT_ARRAY) {
                pcVar6 = "[%s] ARRAY\n";
              }
              else {
                if (SVar1 != OT_CLOSURE) goto LAB_0012a59e;
                pcVar6 = "[%s] CLOSURE\n";
              }
              goto LAB_0012a596;
            }
            if (SVar1 == OT_FLOAT) {
              sq_getfloat(v,-1,&local_64);
              (*p_Var2)(v,"[%s] %.14g\n",(double)local_64,pSVar4);
            }
            else if (SVar1 == OT_STRING) {
              sq_getstring(v,-1,&local_58);
              pcVar5 = "[%s] \"%s\"\n";
              pcVar6 = local_58;
              goto LAB_0012a56a;
            }
          }
LAB_0012a59e:
          sq_pop(v,1);
          pSVar4 = sq_getlocal(v,level_00,idx);
          idx = idx + 1;
        } while (pSVar4 != (SQChar *)0x0);
      }
      level_00 = level_00 + 1;
    } while (level_00 != 10);
  }
  return;
}

Assistant:

void sqstd_printcallstack(HSQUIRRELVM v)
{
    SQPRINTFUNCTION pf = sq_geterrorfunc(v);
    if(pf) {
        SQStackInfos si;
        SQInteger i;
        SQFloat f;
        const SQChar *s;
        SQInteger level=1; //1 is to skip this function that is level 0
        const SQChar *name=0;
        SQInteger seq=0;
        pf(v,_SC("\nCALLSTACK\n"));
        while(SQ_SUCCEEDED(sq_stackinfos(v,level,&si)))
        {
            const SQChar *fn=_SC("unknown");
            const SQChar *src=_SC("unknown");
            if(si.funcname)fn=si.funcname;
            if(si.source)src=si.source;
            pf(v,_SC("*FUNCTION [%s()] %s line [%d]\n"),fn,src,si.line);
            level++;
        }
        level=0;
        pf(v,_SC("\nLOCALS\n"));

        for(level=0;level<10;level++){
            seq=0;
            while((name = sq_getlocal(v,level,seq)))
            {
                seq++;
                switch(sq_gettype(v,-1))
                {
                case OT_NULL:
                    pf(v,_SC("[%s] NULL\n"),name);
                    break;
                case OT_INTEGER:
                    sq_getinteger(v,-1,&i);
                    pf(v,_SC("[%s] %d\n"),name,i);
                    break;
                case OT_FLOAT:
                    sq_getfloat(v,-1,&f);
                    pf(v,_SC("[%s] %.14g\n"),name,f);
                    break;
                case OT_USERPOINTER:
                    pf(v,_SC("[%s] USERPOINTER\n"),name);
                    break;
                case OT_STRING:
                    sq_getstring(v,-1,&s);
                    pf(v,_SC("[%s] \"%s\"\n"),name,s);
                    break;
                case OT_TABLE:
                    pf(v,_SC("[%s] TABLE\n"),name);
                    break;
                case OT_ARRAY:
                    pf(v,_SC("[%s] ARRAY\n"),name);
                    break;
                case OT_CLOSURE:
                    pf(v,_SC("[%s] CLOSURE\n"),name);
                    break;
                case OT_NATIVECLOSURE:
                    pf(v,_SC("[%s] NATIVECLOSURE\n"),name);
                    break;
                case OT_GENERATOR:
                    pf(v,_SC("[%s] GENERATOR\n"),name);
                    break;
                case OT_USERDATA:
                    pf(v,_SC("[%s] USERDATA\n"),name);
                    break;
                case OT_THREAD:
                    pf(v,_SC("[%s] THREAD\n"),name);
                    break;
                case OT_CLASS:
                    pf(v,_SC("[%s] CLASS\n"),name);
                    break;
                case OT_INSTANCE:
                    pf(v,_SC("[%s] INSTANCE\n"),name);
                    break;
                case OT_WEAKREF:
                    pf(v,_SC("[%s] WEAKREF\n"),name);
                    break;
                case OT_BOOL:{
                    SQBool bval;
                    sq_getbool(v,-1,&bval);
                    pf(v,_SC("[%s] %s\n"),name,bval == SQTrue ? _SC("true"):_SC("false"));
                             }
                    break;
                default: assert(0); break;
                }
                sq_pop(v,1);
            }
        }
    }
}